

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3ExprCheckIN(Parse *pParse,Expr *pIn)

{
  int nExpect;
  int nVector;
  Expr *pIn_local;
  Parse *pParse_local;
  
  nExpect = sqlite3ExprVectorSize(pIn->pLeft);
  if ((pIn->flags & 0x800) == 0) {
    if (nExpect != 1) {
      sqlite3VectorErrorMsg(pParse,pIn->pLeft);
      return 1;
    }
  }
  else if (nExpect != ((pIn->x).pSelect)->pEList->nExpr) {
    sqlite3SubselectError(pParse,((pIn->x).pSelect)->pEList->nExpr,nExpect);
    return 1;
  }
  return 0;
}

Assistant:

SQLITE_PRIVATE int sqlite3ExprCheckIN(Parse *pParse, Expr *pIn){
  int nVector = sqlite3ExprVectorSize(pIn->pLeft);
  if( (pIn->flags & EP_xIsSelect) ){
    if( nVector!=pIn->x.pSelect->pEList->nExpr ){
      sqlite3SubselectError(pParse, pIn->x.pSelect->pEList->nExpr, nVector);
      return 1;
    }
  }else if( nVector!=1 ){
    sqlite3VectorErrorMsg(pParse, pIn->pLeft);
    return 1;
  }
  return 0;
}